

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O1

void kv_bid_to_value_to_bid_test(btree_kv_ops *kv_ops)

{
  bid_t *pbVar1;
  bid_t bVar2;
  bid_t bid1;
  timeval __test_begin;
  bid_t local_30;
  timeval local_28;
  
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  memleak_start();
  local_30 = 10;
  pbVar1 = (bid_t *)(*kv_ops->bid2value)(&local_30);
  if (*pbVar1 != local_30) {
    kv_bid_to_value_to_bid_test();
  }
  bVar2 = (*kv_ops->value2bid)(pbVar1);
  if (bVar2 != local_30) {
    kv_bid_to_value_to_bid_test();
  }
  kv_bid_to_value_to_bid_test();
  return;
}

Assistant:

void kv_bid_to_value_to_bid_test(btree_kv_ops *kv_ops)
{
    TEST_INIT();
    memleak_start();

    void *value;
    bid_t bid1, bid2;


    // bid to str value
    bid1 = 10;
    value = kv_ops->bid2value(&bid1);
    TEST_CHK( *(bid_t *)value == bid1 );

    // value to bid
    bid2 = kv_ops->value2bid(value);
    TEST_CHK( bid2 == bid1 );

    memleak_end();
    TEST_RESULT("kv_bid_to_value_to_bid_test");
}